

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
          *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  char __tmp;
  char *pcVar4;
  size_t __len_1;
  ulong uVar5;
  size_t __len;
  size_t __n;
  char *local_48;
  ulong local_40;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *local_38;
  
  local_40 = (ulong)spec->width_;
  __n = local_40 - size;
  if (local_40 < size || __n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar5 = size + lVar3;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    local_48 = (char *)(lVar3 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,&local_48);
    return;
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar5 = lVar3 + local_40;
  local_38 = f;
  if ((ulong)puVar2[3] < uVar5) {
    (**(code **)*puVar2)(puVar2,uVar5);
  }
  puVar2[2] = uVar5;
  local_48 = (char *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar5 = __n >> 1;
    pcVar4 = local_48;
    if (1 < __n) {
      pcVar4 = local_48 + uVar5;
      memset(local_48,(uint)bVar1,uVar5);
    }
    local_48 = pcVar4;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)local_38,&local_48);
    if (local_40 == size) {
      return;
    }
    __n = __n - uVar5;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar4 = local_48;
      if (local_40 != size) {
        pcVar4 = local_48 + __n;
        memset(local_48,(uint)bVar1,__n);
      }
      local_48 = pcVar4;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                    *)local_38,&local_48);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)local_38,&local_48);
    if (local_40 == size) {
      return;
    }
  }
  memset(local_48,(uint)bVar1,__n);
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}